

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O3

double __thiscall Imath_2_5::Vec4<double>::lengthTiny(Vec4<double> *this)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar7 = this->x;
  dVar4 = this->y;
  uVar1 = -(ulong)(dVar7 < -dVar7);
  uVar2 = -(ulong)(dVar4 < -dVar4);
  dVar3 = (double)(~uVar1 & (ulong)dVar7 | (ulong)-dVar7 & uVar1);
  dVar4 = (double)(~uVar2 & (ulong)dVar4 | (ulong)-dVar4 & uVar2);
  dVar7 = this->z;
  uVar1 = -(ulong)(dVar7 < -dVar7);
  dVar5 = (double)(~uVar1 & (ulong)dVar7 | (ulong)-dVar7 & uVar1);
  dVar7 = this->w;
  uVar1 = -(ulong)(dVar7 < -dVar7);
  dVar6 = (double)(~uVar1 & (ulong)dVar7 | (ulong)-dVar7 & uVar1);
  dVar7 = dVar4;
  if (dVar4 <= dVar3) {
    dVar7 = dVar3;
  }
  dVar8 = dVar5;
  if (dVar5 <= dVar7) {
    dVar8 = dVar7;
  }
  dVar7 = dVar6;
  if (dVar6 <= dVar8) {
    dVar7 = dVar8;
  }
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    return 0.0;
  }
  return SQRT((dVar6 / dVar7) * (dVar6 / dVar7) +
              (dVar5 / dVar7) * (dVar5 / dVar7) +
              (dVar3 / dVar7) * (dVar3 / dVar7) + (dVar4 / dVar7) * (dVar4 / dVar7)) * dVar7;
}

Assistant:

T
Vec4<T>::lengthTiny () const
{
    T absX = (x >= T (0))? x: -x;
    T absY = (y >= T (0))? y: -y;
    T absZ = (z >= T (0))? z: -z;
    T absW = (w >= T (0))? w: -w;
    
    T max = absX;

    if (max < absY)
        max = absY;

    if (max < absZ)
        max = absZ;

    if (max < absW)
        max = absW;

    if (max == T (0))
        return T (0);

    //
    // Do not replace the divisions by max with multiplications by 1/max.
    // Computing 1/max can overflow but the divisions below will always
    // produce results less than or equal to 1.
    //

    absX /= max;
    absY /= max;
    absZ /= max;
    absW /= max;

    return max *
        Math<T>::sqrt (absX * absX + absY * absY + absZ * absZ + absW * absW);
}